

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# openssl.c
# Opt level: O1

void ssl_tls_trace(int direction,int ssl_ver,int content_type,void *buf,size_t len,SSL *ssl,
                  void *userp)

{
  byte bVar1;
  Curl_easy *data;
  char *pcVar2;
  int iVar3;
  char *pcVar4;
  char *pcVar5;
  char *pcVar6;
  char unknown [32];
  char ssl_buf [1024];
  
  pcVar4 = unknown;
  if ((((userp != (void *)0x0) && (data = *userp, data != (Curl_easy *)0x0)) &&
      ((data->set).fdebug != (curl_debug_callback)0x0)) && ((uint)direction < 2)) {
    switch(ssl_ver) {
    case 0x300:
      pcVar4 = "SSLv3";
      break;
    case 0x301:
      pcVar4 = "TLSv1.0";
      break;
    case 0x302:
      pcVar4 = "TLSv1.1";
      break;
    case 0x303:
      pcVar4 = "TLSv1.2";
      break;
    case 0x304:
      pcVar4 = "TLSv1.3";
      break;
    default:
      if (ssl_ver == 0) {
        pcVar4 = (char *)0x0;
      }
      else if (ssl_ver == 2) {
        pcVar4 = "SSLv2";
      }
      else {
        curl_msnprintf(unknown,0x20,"(%x)",(ulong)(uint)ssl_ver);
      }
    }
    if (ssl_ver != 0) {
      if (content_type == 0 || (ssl_ver & 0xffffff00U) != 0x300) {
        pcVar5 = "";
      }
      else {
        switch(content_type) {
        case 0x14:
          pcVar5 = "TLS change cipher";
          break;
        case 0x15:
          pcVar5 = "TLS alert";
          break;
        case 0x16:
          pcVar5 = "TLS handshake";
          break;
        case 0x17:
          pcVar5 = "TLS app data";
          break;
        default:
          if (content_type == 0x100) {
            pcVar5 = "TLS header";
          }
          else {
            pcVar5 = "TLS Unknown";
          }
        }
      }
      bVar1 = *buf;
      if (bVar1 < 0x17 && (ssl_ver & 0xffffff00U) == 0x300) {
        pcVar6 = &DAT_00155708 + *(int *)(&DAT_00155708 + (ulong)bVar1 * 4);
      }
      else {
        pcVar6 = "Unknown";
      }
      pcVar2 = "LOGOUT";
      if (direction == 0) {
        pcVar2 = "PLAIN";
      }
      iVar3 = curl_msnprintf(ssl_buf,0x400,"%s (%s), %s, %s (%d):\n",pcVar4,pcVar2 + 3,pcVar5,pcVar6
                             ,(ulong)(uint)(int)(char)bVar1);
      Curl_debug(data,CURLINFO_TEXT,ssl_buf,(long)iVar3,(connectdata *)0x0);
    }
    Curl_debug(data,(direction == 1) + CURLINFO_SSL_DATA_IN,(char *)buf,len,(connectdata *)0x0);
  }
  return;
}

Assistant:

static void ssl_tls_trace(int direction, int ssl_ver, int content_type,
                          const void *buf, size_t len, SSL *ssl,
                          void *userp)
{
  struct Curl_easy *data;
  const char *msg_name, *tls_rt_name;
  char ssl_buf[1024];
  char unknown[32];
  int msg_type, txt_len;
  const char *verstr = NULL;
  struct connectdata *conn = userp;

  if(!conn || !conn->data || !conn->data->set.fdebug ||
     (direction != 0 && direction != 1))
    return;

  data = conn->data;

  switch(ssl_ver) {
#ifdef SSL2_VERSION /* removed in recent versions */
  case SSL2_VERSION:
    verstr = "SSLv2";
    break;
#endif
#ifdef SSL3_VERSION
  case SSL3_VERSION:
    verstr = "SSLv3";
    break;
#endif
  case TLS1_VERSION:
    verstr = "TLSv1.0";
    break;
#ifdef TLS1_1_VERSION
  case TLS1_1_VERSION:
    verstr = "TLSv1.1";
    break;
#endif
#ifdef TLS1_2_VERSION
  case TLS1_2_VERSION:
    verstr = "TLSv1.2";
    break;
#endif
#ifdef TLS1_3_VERSION
  case TLS1_3_VERSION:
    verstr = "TLSv1.3";
    break;
#endif
  case 0:
    break;
  default:
    snprintf(unknown, sizeof(unknown), "(%x)", ssl_ver);
    verstr = unknown;
    break;
  }

  if(ssl_ver) {
    /* the info given when the version is zero is not that useful for us */

    ssl_ver >>= 8; /* check the upper 8 bits only below */

    /* SSLv2 doesn't seem to have TLS record-type headers, so OpenSSL
     * always pass-up content-type as 0. But the interesting message-type
     * is at 'buf[0]'.
     */
    if(ssl_ver == SSL3_VERSION_MAJOR && content_type)
      tls_rt_name = tls_rt_type(content_type);
    else
      tls_rt_name = "";

    msg_type = *(char *)buf;
    msg_name = ssl_msg_type(ssl_ver, msg_type);

    txt_len = snprintf(ssl_buf, sizeof(ssl_buf), "%s (%s), %s, %s (%d):\n",
                       verstr, direction?"OUT":"IN",
                       tls_rt_name, msg_name, msg_type);
    Curl_debug(data, CURLINFO_TEXT, ssl_buf, (size_t)txt_len, NULL);
  }

  Curl_debug(data, (direction == 1) ? CURLINFO_SSL_DATA_OUT :
             CURLINFO_SSL_DATA_IN, (char *)buf, len, NULL);
  (void) ssl;
}